

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall soplex::SLUFactor<double>::freeAll(SLUFactor<double> *this)

{
  int *piVar1;
  Dring *pDVar2;
  pointer pdVar3;
  Timer *pTVar4;
  
  piVar1 = (this->super_CLUFactor<double>).row.perm;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).row.perm = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).row.orig;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).row.orig = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).col.perm;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).col.perm = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).col.orig;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).col.orig = (int *)0x0;
  }
  pDVar2 = (this->super_CLUFactor<double>).u.row.elem;
  if (pDVar2 != (Dring *)0x0) {
    free(pDVar2);
    (this->super_CLUFactor<double>).u.row.elem = (Dring *)0x0;
  }
  pdVar3 = (this->super_CLUFactor<double>).u.row.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar3 != (this->super_CLUFactor<double>).u.row.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish) {
    (this->super_CLUFactor<double>).u.row.val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar3;
  }
  piVar1 = (this->super_CLUFactor<double>).u.row.idx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.row.idx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).u.row.start;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.row.start = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).u.row.len;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.row.len = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).u.row.max;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.row.max = (int *)0x0;
  }
  pDVar2 = (this->super_CLUFactor<double>).u.col.elem;
  if (pDVar2 != (Dring *)0x0) {
    free(pDVar2);
    (this->super_CLUFactor<double>).u.col.elem = (Dring *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).u.col.idx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.col.idx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).u.col.start;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.col.start = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).u.col.len;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.col.len = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).u.col.max;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).u.col.max = (int *)0x0;
  }
  pdVar3 = (this->super_CLUFactor<double>).l.val.super__Vector_base<double,_std::allocator<double>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar3 != (this->super_CLUFactor<double>).l.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish) {
    (this->super_CLUFactor<double>).l.val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar3;
  }
  piVar1 = (this->super_CLUFactor<double>).l.idx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).l.idx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).l.start;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).l.start = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).l.row;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).l.row = (int *)0x0;
  }
  pdVar3 = (this->super_CLUFactor<double>).u.col.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar3 != (this->super_CLUFactor<double>).u.col.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish) {
    (this->super_CLUFactor<double>).u.col.val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar3;
  }
  piVar1 = (this->super_CLUFactor<double>).l.ridx;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).l.ridx = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).l.rbeg;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).l.rbeg = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).l.rorig;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).l.rorig = (int *)0x0;
  }
  piVar1 = (this->super_CLUFactor<double>).l.rperm;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (this->super_CLUFactor<double>).l.rperm = (int *)0x0;
  }
  if (this->solveTime != (Timer *)0x0) {
    (**this->solveTime->_vptr_Timer)();
    free(this->solveTime);
    this->solveTime = (Timer *)0x0;
  }
  pTVar4 = (this->super_CLUFactor<double>).factorTime;
  if (pTVar4 != (Timer *)0x0) {
    (**pTVar4->_vptr_Timer)();
    free((this->super_CLUFactor<double>).factorTime);
    (this->super_CLUFactor<double>).factorTime = (Timer *)0x0;
  }
  return;
}

Assistant:

void SLUFactor<R>::freeAll()
{

   if(this->row.perm)
      spx_free(this->row.perm);

   if(this->row.orig)
      spx_free(this->row.orig);

   if(this->col.perm)
      spx_free(this->col.perm);

   if(this->col.orig)
      spx_free(this->col.orig);

   if(this->u.row.elem)
      spx_free(this->u.row.elem);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.row.start)
      spx_free(this->u.row.start);

   if(this->u.row.len)
      spx_free(this->u.row.len);

   if(this->u.row.max)
      spx_free(this->u.row.max);

   if(this->u.col.elem)
      spx_free(this->u.col.elem);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->u.col.start)
      spx_free(this->u.col.start);

   if(this->u.col.len)
      spx_free(this->u.col.len);

   if(this->u.col.max)
      spx_free(this->u.col.max);

   if(!this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);


   if(!this->u.col.val.empty())
      this->u.col.val.clear();

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(solveTime)
   {
      solveTime->~Timer();
      spx_free(solveTime);
   }

   if(this->factorTime)
   {
      this->factorTime->~Timer();
      spx_free(this->factorTime);
   }
}